

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O0

void get_skip_mode_ref_offsets(AV1_COMMON *cm,int *ref_order_hint)

{
  AV1_COMMON *cm_00;
  RefCntBuffer *pRVar1;
  uint *in_RSI;
  long in_RDI;
  RefCntBuffer *buf_1;
  RefCntBuffer *buf_0;
  SkipModeInfo *skip_mode_info;
  undefined8 in_stack_ffffffffffffffd8;
  MV_REFERENCE_FRAME ref_frame;
  AV1_COMMON *in_stack_ffffffffffffffe0;
  
  in_RSI[1] = 0;
  *in_RSI = 0;
  if (*(int *)(in_RDI + 0x14) != 0) {
    ref_frame = (MV_REFERENCE_FRAME)((ulong)in_stack_ffffffffffffffd8 >> 0x38);
    cm_00 = (AV1_COMMON *)get_ref_frame_buf(in_stack_ffffffffffffffe0,ref_frame);
    pRVar1 = get_ref_frame_buf(cm_00,ref_frame);
    *in_RSI = (cm_00->current_frame).order_hint;
    in_RSI[1] = pRVar1->order_hint;
  }
  return;
}

Assistant:

static inline void get_skip_mode_ref_offsets(const AV1_COMMON *cm,
                                             int ref_order_hint[2]) {
  const SkipModeInfo *const skip_mode_info = &cm->current_frame.skip_mode_info;
  ref_order_hint[0] = ref_order_hint[1] = 0;
  if (!skip_mode_info->skip_mode_allowed) return;

  const RefCntBuffer *const buf_0 =
      get_ref_frame_buf(cm, LAST_FRAME + skip_mode_info->ref_frame_idx_0);
  const RefCntBuffer *const buf_1 =
      get_ref_frame_buf(cm, LAST_FRAME + skip_mode_info->ref_frame_idx_1);
  assert(buf_0 != NULL && buf_1 != NULL);

  ref_order_hint[0] = buf_0->order_hint;
  ref_order_hint[1] = buf_1->order_hint;
}